

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ShowRef::Deserialize(ShowRef *this,Deserializer *deserializer)

{
  ShowType SVar1;
  uint uVar2;
  int iVar3;
  ShowRef *this_00;
  pointer pSVar4;
  pointer *__ptr;
  byte bVar5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var7;
  unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::ShowRef_*,_false> local_58;
  undefined1 local_50 [32];
  
  this_00 = (ShowRef *)operator_new(0x98);
  ShowRef(this_00);
  local_58._M_head_impl = this_00;
  pSVar4 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_name");
  if ((char)uVar2 == '\0') {
    local_50._8_8_ = 0;
    local_50[0x10] = 0;
    local_50._0_8_ = (QueryNode *)(local_50 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pSVar4->table_name,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) goto LAB_005d9606;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pSVar4->table_name,(string *)local_50);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
LAB_005d9606:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pSVar4 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_58);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"query");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pSVar4->query).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar4->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 0;
      goto LAB_005d96bc;
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var7._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_50,deserializer);
      _Var7._M_head_impl = (QueryNode *)local_50._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pSVar4->query).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar4->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 1;
      goto LAB_005d96bc;
    }
  }
  (*(_Var6._M_head_impl)->_vptr_QueryNode[1])();
LAB_005d96bc:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pSVar4 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"show_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    SVar1 = EnumUtil::FromString<duckdb::ShowType>((char *)local_50._0_8_);
    if ((QueryNode *)local_50._0_8_ != (QueryNode *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    SVar1 = (ShowType)iVar3;
  }
  pSVar4->show_type = SVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> ShowRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ShowRef>(new ShowRef());
	deserializer.ReadPropertyWithDefault<string>(200, "table_name", result->table_name);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(201, "query", result->query);
	deserializer.ReadProperty<ShowType>(202, "show_type", result->show_type);
	return std::move(result);
}